

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mcpl.c
# Opt level: O0

void mcpl_dump_header(mcpl_file_t f)

{
  mcpl_file_t ff;
  uint uVar1;
  int iVar2;
  int32_t iVar3;
  uint64_t uVar4;
  mcpl_file_t ff_00;
  char *pcVar5;
  char **ppcVar6;
  mcpl_file_t in_RDI;
  double dVar7;
  double uw;
  int32_t updg;
  int ok;
  uint32_t ldata;
  char *data;
  uint32_t ib;
  char **blobkeys;
  uint nb;
  uint ic;
  uint nc;
  uint uVar8;
  uint32_t *in_stack_ffffffffffffffb8;
  undefined4 in_stack_ffffffffffffffc0;
  undefined4 in_stack_ffffffffffffffc4;
  int in_stack_ffffffffffffffc8;
  uint in_stack_ffffffffffffffcc;
  uint local_24;
  uint local_10;
  
  printf("\n  Basic info\n");
  uVar1 = mcpl_hdr_version(in_RDI);
  printf("    Format             : MCPL-%i\n",(ulong)uVar1);
  uVar4 = mcpl_hdr_nparticles(in_RDI);
  printf("    No. of particles   : %lu\n",uVar4);
  uVar4 = mcpl_hdr_header_size(in_RDI);
  printf("    Header storage     : %lu bytes\n",uVar4);
  ff_00.internal = (void *)mcpl_hdr_nparticles(in_RDI);
  iVar2 = mcpl_hdr_particle_size(in_RDI);
  printf("    Data storage       : %lu bytes\n",(long)ff_00.internal * (long)iVar2);
  printf("\n  Custom meta data\n");
  pcVar5 = mcpl_hdr_srcname(in_RDI);
  printf("    Source             : \"%s\"\n",pcVar5);
  uVar1 = mcpl_hdr_ncomments(in_RDI);
  printf("    Number of comments : %i\n",(ulong)uVar1);
  for (local_10 = 0; local_10 < uVar1; local_10 = local_10 + 1) {
    uVar8 = local_10;
    pcVar5 = mcpl_hdr_comment(ff_00,local_10);
    printf("          -> comment %i : \"%s\"\n",(ulong)uVar8,pcVar5);
  }
  uVar1 = mcpl_hdr_nblobs(in_RDI);
  printf("    Number of blobs    : %i\n",(ulong)uVar1);
  ppcVar6 = mcpl_hdr_blobkeys(in_RDI);
  for (local_24 = 0; local_24 < uVar1; local_24 = local_24 + 1) {
    ff.internal._4_4_ = in_stack_ffffffffffffffcc;
    ff.internal._0_4_ = in_stack_ffffffffffffffc8;
    in_stack_ffffffffffffffc8 =
         mcpl_hdr_blob(ff,(char *)CONCAT44(in_stack_ffffffffffffffc4,in_stack_ffffffffffffffc0),
                       in_stack_ffffffffffffffb8,(char **)ff_00.internal);
    if (in_stack_ffffffffffffffc8 == 0) {
      mcpl_error((char *)0x106c25);
    }
    printf("          -> %lu bytes of data with key \"%s\"\n",(ulong)in_stack_ffffffffffffffcc,
           ppcVar6[local_24]);
  }
  printf("\n  Particle data format\n");
  iVar2 = mcpl_hdr_has_userflags(in_RDI);
  pcVar5 = "no";
  if (iVar2 != 0) {
    pcVar5 = "yes";
  }
  printf("    User flags         : %s\n",pcVar5);
  iVar2 = mcpl_hdr_has_polarisation(in_RDI);
  pcVar5 = "no";
  if (iVar2 != 0) {
    pcVar5 = "yes";
  }
  printf("    Polarisation info  : %s\n",pcVar5);
  printf("    Fixed part. type   : ");
  iVar3 = mcpl_hdr_universal_pdgcode(in_RDI);
  if (iVar3 == 0) {
    printf("no\n");
  }
  else {
    printf("yes (pdgcode %li)\n",(long)iVar3);
  }
  printf("    Fixed part. weight : ");
  dVar7 = mcpl_hdr_universal_weight(in_RDI);
  if ((dVar7 != 0.0) || (NAN(dVar7))) {
    printf("yes (weight %g)\n",dVar7);
  }
  else {
    printf("no\n");
  }
  iVar2 = mcpl_hdr_has_doubleprec(in_RDI);
  pcVar5 = "single";
  if (iVar2 != 0) {
    pcVar5 = "double";
  }
  printf("    FP precision       : %s\n",pcVar5);
  iVar2 = mcpl_hdr_little_endian(in_RDI);
  pcVar5 = "big";
  if (iVar2 != 0) {
    pcVar5 = "little";
  }
  printf("    Endianness         : %s\n",pcVar5);
  uVar1 = mcpl_hdr_particle_size(in_RDI);
  printf("    Storage            : %i bytes/particle\n",(ulong)uVar1);
  printf("\n");
  return;
}

Assistant:

void mcpl_dump_header(mcpl_file_t f)
{
  printf("\n  Basic info\n");
  printf("    Format             : MCPL-%i\n",mcpl_hdr_version(f));
  printf("    No. of particles   : %" PRIu64 "\n",mcpl_hdr_nparticles(f));
  printf("    Header storage     : %" PRIu64 " bytes\n",mcpl_hdr_header_size(f));
  printf("    Data storage       : %" PRIu64 " bytes\n",mcpl_hdr_nparticles(f)*mcpl_hdr_particle_size(f));
  printf("\n  Custom meta data\n");
  printf("    Source             : \"%s\"\n",mcpl_hdr_srcname(f));
  unsigned nc=mcpl_hdr_ncomments(f);
  printf("    Number of comments : %i\n",nc);
  unsigned ic;
  for (ic = 0; ic < nc; ++ic)
    printf("          -> comment %i : \"%s\"\n",ic,mcpl_hdr_comment(f,ic));
  unsigned nb = mcpl_hdr_nblobs(f);
  printf("    Number of blobs    : %i\n",nb);
  const char** blobkeys = mcpl_hdr_blobkeys(f);
  uint32_t ib;
  for (ib = 0; ib < nb; ++ib) {
    const char * data;
    uint32_t ldata;
    int ok = mcpl_hdr_blob(f, blobkeys[ib], &ldata, &data);
    if (!ok)
      mcpl_error("Unexpected blob access error");
    printf("          -> %lu bytes of data with key \"%s\"\n",(unsigned long)ldata,blobkeys[ib]);
  }

  printf("\n  Particle data format\n");
  printf("    User flags         : %s\n",(mcpl_hdr_has_userflags(f)?"yes":"no"));
  printf("    Polarisation info  : %s\n",(mcpl_hdr_has_polarisation(f)?"yes":"no"));
  printf("    Fixed part. type   : ");
  int32_t updg = mcpl_hdr_universal_pdgcode(f);
  if (updg)
    printf("yes (pdgcode %li)\n",(long)updg);
  else
    printf("no\n");
  printf("    Fixed part. weight : ");
  double uw = mcpl_hdr_universal_weight(f);
  if (uw)
    printf("yes (weight %g)\n",uw);
  else
    printf("no\n");
  printf("    FP precision       : %s\n",(mcpl_hdr_has_doubleprec(f)?"double":"single"));
  printf("    Endianness         : %s\n",(mcpl_hdr_little_endian(f)?"little":"big"));
  printf("    Storage            : %i bytes/particle\n",mcpl_hdr_particle_size(f));

  printf("\n");
}